

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.h
# Opt level: O0

void TRM::LinkedList<TRM::Vertex>::Insert<&TRM::Vertex::prev,&TRM::Vertex::next>
               (Vertex *t,Vertex *prev,Vertex *next,Vertex **head,Vertex **tail)

{
  Vertex **tail_local;
  Vertex **head_local;
  Vertex *next_local;
  Vertex *prev_local;
  Vertex *t_local;
  
  *(Vertex **)(t + 8) = prev;
  *(Vertex **)(t + 0x10) = next;
  if (prev == (Vertex *)0x0) {
    if (head != (Vertex **)0x0) {
      *head = t;
    }
  }
  else {
    *(Vertex **)(prev + 0x10) = t;
  }
  if (next == (Vertex *)0x0) {
    if (tail != (Vertex **)0x0) {
      *tail = t;
    }
  }
  else {
    *(Vertex **)(next + 8) = t;
  }
  return;
}

Assistant:

static void Insert(T* t, T* prev, T* next, T** head, T** tail) {
    t->*Prev = prev;
    t->*Next = next;

    if (prev) {
      prev->*Next = t;
    } else if (head) {
      *head = t;
    }

    if (next) {
      next->*Prev = t;
    } else if (tail) {
      *tail = t;
    }
  }